

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void __thiscall ExpressionContext::AddAlias(ExpressionContext *this,AliasData *alias)

{
  uint uVar1;
  AliasData **ppAVar2;
  undefined1 auVar3 [16];
  ScopeData *pSVar4;
  
  pSVar4 = this->scope;
  uVar1 = (pSVar4->aliases).count;
  if (uVar1 == (pSVar4->aliases).max) {
    SmallArray<AliasData_*,_2U>::grow(&pSVar4->aliases,uVar1);
  }
  ppAVar2 = (pSVar4->aliases).data;
  if (ppAVar2 != (AliasData **)0x0) {
    uVar1 = (pSVar4->aliases).count;
    (pSVar4->aliases).count = uVar1 + 1;
    ppAVar2[uVar1] = alias;
    pSVar4 = this->scope;
    if (pSVar4->type == SCOPE_NAMESPACE) {
      pSVar4 = this->globalScope;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = alias;
    DirectChainedMap<TypeLookupResult>::insert
              (&pSVar4->typeLookupMap,alias->nameHash,(TypeLookupResult)(auVar3 << 0x40));
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<AliasData *, 2>::push_back(const T &) [T = AliasData *, N = 2]");
}

Assistant:

void ExpressionContext::AddAlias(AliasData *alias)
{
	scope->aliases.push_back(alias);

	// Namespaces are allowed only in global scope and namespaced alias names are globally accessible through namespace name
	if(scope->type == SCOPE_NAMESPACE)
		globalScope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
	else
		scope->typeLookupMap.insert(alias->nameHash, TypeLookupResult(alias));
}